

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lib.c
# Opt level: O2

int lj_lib_checkopt(lua_State *L,int narg,int def,char *lst)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  GCstr *pGVar4;
  int iVar5;
  
  if (def < 0) {
    pGVar4 = lj_lib_checkstr(L,narg);
  }
  else {
    pGVar4 = lj_lib_optstr(L,narg);
  }
  if (pGVar4 == (GCstr *)0x0) {
    return def;
  }
  uVar2 = pGVar4->len;
  iVar5 = 0;
  while( true ) {
    bVar1 = *lst;
    if (bVar1 == 0) {
      lj_err_argv(L,narg,LJ_ERR_INVOPTM,pGVar4 + 1);
    }
    if ((uVar2 == bVar1) && (iVar3 = bcmp(pGVar4 + 1,(byte *)lst + 1,(ulong)uVar2), iVar3 == 0))
    break;
    lst = (char *)((byte *)lst + (ulong)(uint)bVar1 + 1);
    iVar5 = iVar5 + 1;
  }
  return iVar5;
}

Assistant:

int lj_lib_checkopt(lua_State *L, int narg, int def, const char *lst)
{
  GCstr *s = def >= 0 ? lj_lib_optstr(L, narg) : lj_lib_checkstr(L, narg);
  if (s) {
    const char *opt = strdata(s);
    MSize len = s->len;
    int i;
    for (i = 0; *(const uint8_t *)lst; i++) {
      if (*(const uint8_t *)lst == len && memcmp(opt, lst+1, len) == 0)
	return i;
      lst += 1+*(const uint8_t *)lst;
    }
    lj_err_argv(L, narg, LJ_ERR_INVOPTM, opt);
  }
  return def;
}